

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O2

void do_org(int *ip)

{
  int iVar1;
  char *stptr;
  
  iVar1 = evaluate(ip,';');
  if (iVar1 == 0) {
    return;
  }
  if (undef == 0) {
    if (section - 2U < 2) {
      if (proc_ptr != (t_proc *)0x0) {
        fatal_error("ORG can not be changed in procs!");
        return;
      }
      if (value < 0x10000) {
        page = value >> 0xd;
        goto LAB_0010a586;
      }
    }
    else if (section == 0) {
      if (((value & 0xffffff00) == 0) || ((value & 0xffffff00) == machine->ram_base))
      goto LAB_0010a586;
    }
    else if ((section != 1) ||
            ((machine->ram_base <= value && (value < machine->ram_base + machine->ram_limit)))) {
LAB_0010a586:
      loccnt = value & 0x1fff;
      labldef(loccnt,1);
      if (pass != 1) {
        return;
      }
      loadlc(value,1);
      println();
      return;
    }
    stptr = "Invalid address!";
  }
  else {
    stptr = "Undefined symbol in operand field!";
  }
  error(stptr);
  return;
}

Assistant:

void
do_org(int *ip)
{
	/* get the .org value */
	if (!evaluate(ip, ';'))
		return;

	/* check for undefined symbol - they are not allowed in .org */
	if (undef != 0) {
		error("Undefined symbol in operand field!");
		return;
	}

	/* section switch */
	switch (section) {
	case S_ZP:
		/* zero page section */
		if ((value & 0xFFFFFF00) && ((value & 0xFFFFFF00) != machine->ram_base)) {
			error("Invalid address!");
			return;
		}
		break;

	case S_BSS:
		/* ram section */
		if ((value < machine->ram_base) || (value >= (machine->ram_base + machine->ram_limit))) {
			error("Invalid address!");
			return;
		}
		break;

	case S_CODE:
	case S_DATA:
		/* not allowed in procs */
		if (proc_ptr) {
			fatal_error("ORG can not be changed in procs!");
			return;
		}

		/* code and data section */
		if (value & 0xFFFF0000) {
			error("Invalid address!");
			return;
		}
		page = (value >> 13) & 0x07;
		break;
	}

	/* set location counter */
	loccnt = (value & 0x1FFF);

	/* set label value if there was one */
	labldef(loccnt, 1);

	/* output line on last pass */
	if (pass == LAST_PASS) {
		loadlc(value, 1);
		println();
	}
}